

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O2

void client_connect(void)

{
  int iVar1;
  uv_tcp_t *tcp;
  uv_connect_t *req;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *__format;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  
  tcp = (uv_tcp_t *)malloc(0xd8);
  req = (uv_connect_t *)malloc(0x68);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    if (tcp == (uv_tcp_t *)0x0) {
      pcVar3 = "client";
      uVar2 = 0x9f;
    }
    else {
      if (req != (uv_connect_t *)0x0) {
        loop = uv_default_loop();
        iVar1 = uv_tcp_init(loop,tcp);
        eval_a = (int64_t)iVar1;
        if (eval_a == 0) {
          iVar1 = uv_tcp_connect(req,tcp,(sockaddr *)&addr,connect_cb);
          eval_a = (int64_t)iVar1;
          if (eval_a == 0) {
            return;
          }
          pcVar3 = "r";
          uVar2 = 0xa9;
        }
        else {
          pcVar3 = "r";
          uVar2 = 0xa3;
        }
        goto LAB_001172c5;
      }
      pcVar3 = "connect_req";
      uVar2 = 0xa0;
    }
    pcVar6 = "!=";
    eval_a = 0;
    pcVar5 = "NULL";
    pcVar4 = "!=";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
  }
  else {
    pcVar3 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar2 = 0x9e;
LAB_001172c5:
    pcVar4 = "==";
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar6 = "==";
    pcVar5 = "0";
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-delayed-accept.c"
          ,uVar2,pcVar3,pcVar4,pcVar5,eval_a,pcVar6,0);
  abort();
}

Assistant:

static void client_connect(void) {
  struct sockaddr_in addr;
  uv_tcp_t* client = (uv_tcp_t*)malloc(sizeof *client);
  uv_connect_t* connect_req = malloc(sizeof *connect_req);
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT_NOT_NULL(client);
  ASSERT_NOT_NULL(connect_req);

  r = uv_tcp_init(uv_default_loop(), client);
  ASSERT_OK(r);

  r = uv_tcp_connect(connect_req,
                     client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);
}